

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

Acec_Box_t *
Acec_DeriveBox(Gia_Man_t *p,Vec_Bit_t *vIgnore,int fFilterIn,int fFilterOut,int fVerbose)

{
  Vec_Wec_t *vAdds_00;
  Vec_Bit_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vTree;
  Vec_Wec_t *local_40;
  Vec_Wec_t *vTrees;
  Vec_Int_t *vAdds;
  Acec_Box_t *pBox;
  int local_20;
  int fVerbose_local;
  int fFilterOut_local;
  int fFilterIn_local;
  Vec_Bit_t *vIgnore_local;
  Gia_Man_t *p_local;
  
  vAdds = (Vec_Int_t *)0x0;
  pBox._4_4_ = fVerbose;
  local_20 = fFilterOut;
  fVerbose_local = fFilterIn;
  _fFilterOut_local = vIgnore;
  vIgnore_local = (Vec_Bit_t *)p;
  vTrees = (Vec_Wec_t *)Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,fVerbose);
  local_40 = Acec_TreeFindTrees((Gia_Man_t *)vIgnore_local,(Vec_Int_t *)vTrees,_fFilterOut_local,
                                fVerbose_local,local_20);
  if (local_40 != (Vec_Wec_t *)0x0) {
    iVar1 = Vec_WecSize(local_40);
    p_00 = vIgnore_local;
    vAdds_00 = vTrees;
    if (0 < iVar1) {
      vTree = Vec_WecEntry(local_40,0);
      vAdds = (Vec_Int_t *)Acec_CreateBox((Gia_Man_t *)p_00,(Vec_Int_t *)vAdds_00,vTree);
      Acec_VerifyBoxLeaves((Acec_Box_t *)vAdds,_fFilterOut_local);
    }
  }
  if (vAdds != (Vec_Int_t *)0x0) {
    uVar2 = Vec_WecSize((Vec_Wec_t *)vAdds->pArray);
    uVar3 = Vec_WecSizeSize((Vec_Wec_t *)vAdds->pArray);
    uVar4 = Vec_WecSizeSize(*(Vec_Wec_t **)(vAdds + 1));
    uVar5 = Vec_WecSizeSize((Vec_Wec_t *)vAdds[1].pArray);
    printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",0,
           (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  }
  if ((vAdds != (Vec_Int_t *)0x0) && (pBox._4_4_ != 0)) {
    Acec_TreePrintBox((Acec_Box_t *)vAdds,(Vec_Int_t *)vTrees);
  }
  Vec_WecFreeP(&local_40);
  Vec_IntFree((Vec_Int_t *)vTrees);
  return (Acec_Box_t *)vAdds;
}

Assistant:

Acec_Box_t * Acec_DeriveBox( Gia_Man_t * p, Vec_Bit_t * vIgnore, int fFilterIn, int fFilterOut, int fVerbose )
{
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, fVerbose );
    Vec_Wec_t * vTrees = Acec_TreeFindTrees( p, vAdds, vIgnore, fFilterIn, fFilterOut );
    if ( vTrees && Vec_WecSize(vTrees) > 0 )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, 0) );
        Acec_VerifyBoxLeaves( pBox, vIgnore );
    }
    if ( pBox )//&& fVerbose )
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            0, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
    if ( pBox && fVerbose )
        Acec_TreePrintBox( pBox, vAdds );
    //Acec_PrintAdders( pBox0->vAdds, vAdds );
    //Acec_MultDetectInputs( p, pBox->vLeafLits, pBox->vRootLits );
    Vec_WecFreeP( &vTrees );
    Vec_IntFree( vAdds );
    return pBox;
}